

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)400>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  GLMClassifier_PostEvaluationTransform GVar2;
  GLMClassifier_ClassEncoding GVar3;
  int iVar4;
  int iVar5;
  ClassLabelsCase CVar6;
  ModelDescription *from;
  GLMClassifier *pGVar7;
  CoreML *this;
  Int64Vector *this_00;
  StringVector *this_01;
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> *other;
  GLMClassifier_DoubleArray *pGVar8;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  undefined1 in_R9B;
  allocator local_2e9;
  string local_2e8;
  int local_2c8;
  allocator local_2c1;
  int i;
  undefined1 local_2a0 [8];
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> weights;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  int local_1e8;
  allocator local_1e1;
  int numClasses;
  allocator local_1b9;
  string local_1b8;
  int local_198;
  allocator local_191;
  int numCoefficient;
  allocator local_169;
  string local_168;
  undefined1 local_148 [8];
  GLMClassifier glmClassifier;
  undefined1 local_b8 [8];
  Result result;
  ModelDescription interface;
  Model *format_local;
  
  from = Specification::Model::description(format);
  Specification::ModelDescription::ModelDescription
            ((ModelDescription *)((long)&result.m_message.field_2 + 8),from);
  pGVar7 = Specification::Model::glmclassifier(format);
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::GLMClassifier>
            ((Result *)local_b8,(CoreML *)format,(Model *)pGVar7,(GLMClassifier *)0x0,false,
             (bool)in_R9B);
  bVar1 = Result::good((Result *)local_b8);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_b8);
    goto LAB_00998064;
  }
  this = (CoreML *)
         Specification::ModelDescription::input
                   ((ModelDescription *)((long)&result.m_message.field_2 + 8));
  validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)&glmClassifier._cached_size_,this,features);
  Result::operator=((Result *)local_b8,(Result *)&glmClassifier._cached_size_);
  Result::~Result((Result *)&glmClassifier._cached_size_);
  bVar1 = Result::good((Result *)local_b8);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_b8);
    goto LAB_00998064;
  }
  pGVar7 = Specification::Model::glmclassifier(format);
  Specification::GLMClassifier::GLMClassifier((GLMClassifier *)local_148,pGVar7);
  GVar2 = Specification::GLMClassifier::postevaluationtransform((GLMClassifier *)local_148);
  if ((GVar2 == GLMClassifier_PostEvaluationTransform_Logit) ||
     (GVar2 = Specification::GLMClassifier::postevaluationtransform((GLMClassifier *)local_148),
     GVar2 == GLMClassifier_PostEvaluationTransform_Probit)) {
    GVar3 = Specification::GLMClassifier::classencoding((GLMClassifier *)local_148);
    if ((GVar3 == GLMClassifier_ClassEncoding_ReferenceClass) ||
       (GVar3 = Specification::GLMClassifier::classencoding((GLMClassifier *)local_148),
       GVar3 == GLMClassifier_ClassEncoding_OneVsRest)) {
      iVar4 = Specification::GLMClassifier::weights_size((GLMClassifier *)local_148);
      local_198 = iVar4;
      if (iVar4 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1b8,
                   "The number of DoubleArrays in weights must be greater than zero",&local_1b9);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      else {
        iVar5 = Specification::GLMClassifier::offset_size((GLMClassifier *)local_148);
        if (iVar4 == iVar5) {
          CVar6 = Specification::GLMClassifier::ClassLabels_case((GLMClassifier *)local_148);
          if (CVar6 == CLASSLABELS_NOT_SET) {
            local_1e8 = -1;
          }
          else if (CVar6 == kStringClassLabels) {
            this_01 = Specification::GLMClassifier::stringclasslabels((GLMClassifier *)local_148);
            local_1e8 = Specification::StringVector::vector_size(this_01);
          }
          else if (CVar6 == kInt64ClassLabels) {
            this_00 = Specification::GLMClassifier::int64classlabels((GLMClassifier *)local_148);
            local_1e8 = Specification::Int64Vector::vector_size(this_00);
          }
          GVar3 = Specification::GLMClassifier::classencoding((GLMClassifier *)local_148);
          if (GVar3 == GLMClassifier_ClassEncoding_ReferenceClass) {
            if ((local_1e8 == -1) || (local_198 == local_1e8 + -1)) goto LAB_00997c94;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_208,
                       "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes"
                       ,&local_209);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::allocator<char>::~allocator((allocator<char> *)&local_209);
          }
          else if (local_1e8 == 2) {
            if (local_198 == 1) {
LAB_00997c94:
              if ((local_1e8 < 3) ||
                 (GVar2 = Specification::GLMClassifier::postevaluationtransform
                                    ((GLMClassifier *)local_148),
                 GVar2 != GLMClassifier_PostEvaluationTransform_Probit)) {
                other = Specification::GLMClassifier::weights((GLMClassifier *)local_148);
                google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                ::RepeatedPtrField((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                    *)local_2a0,other);
                pGVar8 = google::protobuf::
                         RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
                         operator[]((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                     *)local_2a0,0);
                iVar4 = Specification::GLMClassifier_DoubleArray::value_size(pGVar8);
                if (iVar4 == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&i,"Weight DoubleArrays must have nonzero length",&local_2c1)
                  ;
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&i);
                  std::__cxx11::string::~string((string *)&i);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
                }
                else {
                  for (local_2c8 = 1; iVar4 = local_2c8,
                      iVar5 = google::protobuf::
                              RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
                              size((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                    *)local_2a0), iVar4 < iVar5; local_2c8 = local_2c8 + 1) {
                    pGVar8 = google::protobuf::
                             RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
                             operator[]((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                         *)local_2a0,0);
                    iVar4 = Specification::GLMClassifier_DoubleArray::value_size(pGVar8);
                    pGVar8 = google::protobuf::
                             RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
                             operator[]((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                         *)local_2a0,local_2c8);
                    iVar5 = Specification::GLMClassifier_DoubleArray::value_size(pGVar8);
                    if (iVar4 != iVar5) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_2e8,
                                 "Weight DoubleArrays must have the same length",&local_2e9);
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_2e8);
                      std::__cxx11::string::~string((string *)&local_2e8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
                      goto LAB_0099802c;
                    }
                  }
                  Result::Result(__return_storage_ptr__);
                }
LAB_0099802c:
                google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                ::~RepeatedPtrField((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                     *)local_2a0);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_280,
                           "Probit post evaluation transform is only supported for binary classification"
                           ,(allocator *)((long)&weights.super_RepeatedPtrFieldBase.rep_ + 7));
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_280);
                std::__cxx11::string::~string((string *)&local_280);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)&weights.super_RepeatedPtrFieldBase.rep_ + 7));
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_230,
                         "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one"
                         ,&local_231);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_230);
              std::__cxx11::string::~string((string *)&local_230);
              std::allocator<char>::~allocator((allocator<char> *)&local_231);
            }
          }
          else {
            if ((local_1e8 == -1) || (local_198 == local_1e8)) goto LAB_00997c94;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_258,
                       "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes"
                       ,&local_259);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_258);
            std::__cxx11::string::~string((string *)&local_258);
            std::allocator<char>::~allocator((allocator<char> *)&local_259);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&numClasses,
                     "The number of DoubleArrays in weights must match number of offsets",&local_1e1
                    );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&numClasses);
          std::__cxx11::string::~string((string *)&numClasses);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&numCoefficient,"Invalid class encoding",&local_191);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&numCoefficient);
      std::__cxx11::string::~string((string *)&numCoefficient);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_168,"Invalid post evaluation transform",&local_169);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  Specification::GLMClassifier::~GLMClassifier((GLMClassifier *)local_148);
LAB_00998064:
  Result::~Result((Result *)local_b8);
  Specification::ModelDescription::~ModelDescription
            ((ModelDescription *)((long)&result.m_message.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmClassifier>(const Specification::Model& format) {

        // Check has a classifier interface
        Specification::ModelDescription interface = format.description();
        Result result = validateClassifierInterface(format, format.glmclassifier());
        if (!result.good()) {
            return result;
        }
        
        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(interface.input());
        if (!result.good()) {
            return result;
        }

        Specification::GLMClassifier glmClassifier = format.glmclassifier();

        // Check PostEvluationTransfrom and ClassEncoding have allowed values
        if(glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Logit
           && glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid post evaluation transform");
        }
        if(glmClassifier.classencoding() != Specification::GLMClassifier::ReferenceClass
           && glmClassifier.classencoding() != Specification::GLMClassifier::OneVsRest) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid class encoding");
        }

        // Check has weights and same size as offsets
        int numCoefficient = glmClassifier.weights_size();
        if(numCoefficient == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must be greater than zero");
        }
        if(numCoefficient != glmClassifier.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must match number of offsets");
        }

        // Check number of weight vector makes sense based on the number of classes and the class encoding
        int numClasses;
        switch (glmClassifier.ClassLabels_case()) {
            case Specification::GLMClassifier::kInt64ClassLabels:
                numClasses = glmClassifier.int64classlabels().vector_size();
                break;
            case Specification::GLMClassifier::kStringClassLabels:
                numClasses = glmClassifier.stringclasslabels().vector_size();
                break;
            case Specification::GLMClassifier::CLASSLABELS_NOT_SET:
                numClasses = -1;
                break;
        }
        if(glmClassifier.classencoding() == Specification::GLMClassifier::ReferenceClass) {
            if (numClasses != -1 && numCoefficient != numClasses - 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes");
            }
        } else { // One vs Rest encoding
            if(numClasses == 2) {
                if(numCoefficient != 1) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one");
                }
            } else if (numClasses != -1 && numCoefficient != numClasses) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes");
            }
        }

        // Probit is only supported for binary classification
        if(numClasses > 2 && glmClassifier.postevaluationtransform() == Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Probit post evaluation transform is only supported for binary classification");
        }

        // Check all DoubleArrays in weights have the same, nonzero length
        auto weights = glmClassifier.weights();
        if(weights[0].value_size() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have nonzero length");
        }
        for(int i = 1; i < weights.size(); i++) {
            if(weights[0].value_size() != weights[i].value_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have the same length");
            }
        }

        return Result();
    }